

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFBoundingBox.cpp
# Opt level: O2

void __thiscall ZXing::Pdf417::BoundingBox::calculateMinMaxValues(BoundingBox *this)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  float fVar7;
  double dVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  float fVar12;
  double dVar13;
  
  if ((this->_topLeft).m_hasValue == false) {
    dVar8 = (this->_topRight).m_value.super_PointF.y;
    dVar1 = (this->_bottomRight).m_value.super_PointF.y;
    dVar6 = (double)(float)dVar8;
    (this->_topLeft).m_hasValue = true;
    (this->_topLeft).m_value.super_PointF.x = 0.0;
    (this->_topLeft).m_value.super_PointF.y = dVar6;
    dVar11 = (double)(float)dVar1;
    (this->_bottomLeft).m_hasValue = true;
    (this->_bottomLeft).m_value.super_PointF.x = 0.0;
    (this->_bottomLeft).m_value.super_PointF.y = dVar11;
  }
  else if ((this->_topRight).m_hasValue == true) {
    dVar6 = (this->_topLeft).m_value.super_PointF.y;
    dVar11 = (this->_bottomLeft).m_value.super_PointF.y;
    dVar8 = (this->_topRight).m_value.super_PointF.y;
    dVar1 = (this->_bottomRight).m_value.super_PointF.y;
  }
  else {
    dVar6 = (this->_topLeft).m_value.super_PointF.y;
    dVar13 = (double)(this->_imgWidth + -1);
    dVar8 = (double)(float)dVar6;
    (this->_topRight).m_hasValue = true;
    (this->_topRight).m_value.super_PointF.x = dVar13;
    (this->_topRight).m_value.super_PointF.y = dVar8;
    dVar11 = (this->_bottomLeft).m_value.super_PointF.y;
    dVar1 = (double)(float)dVar11;
    (this->_bottomRight).m_hasValue = true;
    (this->_bottomRight).m_value.super_PointF.x = dVar13;
    (this->_bottomRight).m_value.super_PointF.y = dVar1;
  }
  fVar10 = (float)(this->_bottomLeft).m_value.super_PointF.x;
  fVar12 = (float)(this->_topRight).m_value.super_PointF.x;
  fVar7 = (float)(this->_topLeft).m_value.super_PointF.x;
  fVar9 = (float)(this->_bottomRight).m_value.super_PointF.x;
  uVar2 = -(uint)(fVar10 < fVar7);
  uVar3 = -(uint)(fVar12 < fVar9);
  uVar4 = -(uint)((float)dVar8 < (float)dVar6);
  uVar5 = -(uint)((float)dVar11 < (float)dVar1);
  this->_minX = (int)(float)(~uVar2 & (uint)fVar7 | (uint)fVar10 & uVar2);
  this->_maxX = (int)(float)(~uVar3 & (uint)fVar12 | (uint)fVar9 & uVar3);
  this->_minY = (int)(float)(~uVar4 & (uint)(float)dVar6 | (uint)(float)dVar8 & uVar4);
  this->_maxY = (int)(float)(~uVar5 & (uint)(float)dVar11 | (uint)(float)dVar1 & uVar5);
  return;
}

Assistant:

void
BoundingBox::calculateMinMaxValues()
{
	if (_topLeft == nullptr) {
		_topLeft = ResultPoint(0.f, _topRight.value().y());
		_bottomLeft = ResultPoint(0.f, _bottomRight.value().y());
	}
	else if (_topRight == nullptr) {
		_topRight = ResultPoint(static_cast<float>(_imgWidth - 1), _topLeft.value().y());
		_bottomRight = ResultPoint(static_cast<float>(_imgWidth - 1), _bottomLeft.value().y());
	}

	_minX = static_cast<int>(std::min(_topLeft.value().x(), _bottomLeft.value().x()));
	_maxX = static_cast<int>(std::max(_topRight.value().x(), _bottomRight.value().x()));
	_minY = static_cast<int>(std::min(_topLeft.value().y(), _topRight.value().y()));
	_maxY = static_cast<int>(std::max(_bottomLeft.value().y(), _bottomRight.value().y()));
}